

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O1

uint __thiscall
ThreeWiseHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (ThreeWiseHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  _Elt_pointer puVar8;
  ulong uVar9;
  byte *pbVar10;
  
  ppuVar1 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar2 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar3 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  uVar4 = 0;
  puVar8 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last +
           (long)((c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur +
                 ((((((ulong)((long)ppuVar1 - (long)ppuVar3) >> 3) - 1) +
                   (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Deque_impl_data._M_finish._M_first) - (long)puVar2));
  if (puVar8 != (_Elt_pointer)0x0) {
    uVar9 = (long)puVar2 -
            (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_first;
    puVar8 = puVar8 + (puVar8 == (_Elt_pointer)0x0);
    lVar6 = *(long *)(this + 0x60);
    lVar7 = 0;
    uVar4 = 0;
    do {
      if (uVar9 < 0x200) {
        pbVar10 = puVar2 + lVar7;
      }
      else {
        uVar5 = (uVar9 >> 9) + 0xff80000000000000;
        if (0 < (long)uVar9) {
          uVar5 = uVar9 >> 9;
        }
        pbVar10 = ppuVar3[uVar5] + uVar9 + uVar5 * -0x200;
      }
      uVar4 = uVar4 ^ *(uint *)(lVar6 + (ulong)*pbVar10 * 4);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x400;
      uVar9 = uVar9 + 1;
      puVar8 = puVar8 + -1;
    } while (puVar8 != (_Elt_pointer)0x0);
  }
  return uVar4;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (size_t k = 0; k < c.size(); ++k) {
      answer ^= hashers[k].hashvalues[c[k]];
    }
    return answer;
  }